

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peglib.h
# Opt level: O3

shared_ptr<peg::Ope> __thiscall
peg::seq<peg::Definition&,peg::Definition&,peg::Definition&,std::shared_ptr<peg::Ope>>
          (peg *this,Definition *args,Definition *args_1,Definition *args_2,
          shared_ptr<peg::Ope> *args_3)

{
  peg *ppVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<peg::Ope> sVar3;
  undefined1 local_89;
  shared_ptr<peg::Ope> local_88;
  shared_ptr<peg::Ope> local_78;
  shared_ptr<peg::Ope> local_68;
  Sequence *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  shared_ptr<peg::Ope> local_48;
  peg *local_38;
  
  local_88.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_38 = this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<peg::WeakHolder,std::allocator<peg::WeakHolder>,std::shared_ptr<peg::Holder>&>
            (&local_88.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (WeakHolder **)&local_88,(allocator<peg::WeakHolder> *)&local_68,&args->holder_);
  local_48.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_88.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_48.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_88.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_88.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<peg::WeakHolder,std::allocator<peg::WeakHolder>,std::shared_ptr<peg::Holder>&>
            (&local_88.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (WeakHolder **)&local_88,(allocator<peg::WeakHolder> *)&local_78,&args_1->holder_);
  local_68.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_88.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_68.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_88.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_88.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<peg::WeakHolder,std::allocator<peg::WeakHolder>,std::shared_ptr<peg::Holder>&>
            (&local_88.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (WeakHolder **)&local_88,(allocator<peg::WeakHolder> *)&local_89,&args_2->holder_);
  local_78.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_88.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_78.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_88.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_88.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (args_3->super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_88.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (args_3->super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_88.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_88.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_88.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_88.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_88.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  local_58 = (Sequence *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<peg::Sequence,std::allocator<peg::Sequence>,std::shared_ptr<peg::Ope>,std::shared_ptr<peg::Ope>,std::shared_ptr<peg::Ope>,std::shared_ptr<peg::Ope>>
            (&_Stack_50,&local_58,(allocator<peg::Sequence> *)&local_89,&local_48,&local_68,
             &local_78,&local_88);
  ppVar1 = local_38;
  _Var2._M_pi = _Stack_50._M_pi;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(Sequence **)local_38 = local_58;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_38 + 8) = _Var2._M_pi;
  local_58 = (Sequence *)0x0;
  _Var2._M_pi = extraout_RDX;
  if (local_88.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX_00;
  }
  if (local_78.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX_01;
  }
  if (local_68.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX_02;
  }
  if (local_48.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX_03;
  }
  sVar3.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)ppVar1;
  return (shared_ptr<peg::Ope>)sVar3.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Ope> seq(Args&& ...args) {
    return std::make_shared<Sequence>(static_cast<std::shared_ptr<Ope>>(args)...);
}